

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

void pztopology::TPZLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  Fad<double> *this;
  Fad<double> *val;
  TPZVec<Fad<double>_> *in_RDI;
  Fad<double> x;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffff10;
  Fad<double> *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff28;
  TPZFMatrix<Fad<double>_> *this_00;
  Fad<double> *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffff68;
  
  TPZVec<Fad<double>_>::operator[](in_RDI,0);
  this_00 = (TPZFMatrix<Fad<double>_> *)&stack0xffffffffffffffc8;
  Fad<double>::Fad(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  operator-<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  operator/<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()
                     (this_00,in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20);
  Fad<double>::operator=
            ((Fad<double> *)this_00,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)pFVar1);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_ffffffffffffff10);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff10);
  operator+<double,_Fad<double>,_nullptr>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  operator/<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this = TPZFMatrix<Fad<double>_>::operator()
                   (this_00,(int64_t)pFVar1,(int64_t)in_stack_ffffffffffffff20);
  Fad<double>::operator=
            ((Fad<double> *)this_00,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)pFVar1);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_ffffffffffffff10);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_ffffffffffffff10);
  val = TPZFMatrix<Fad<double>_>::operator()(this_00,(int64_t)pFVar1,(int64_t)this);
  Fad<double>::operator=<double,_nullptr>(this,&val->val_);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(this_00,(int64_t)pFVar1,(int64_t)this);
  Fad<double>::operator=<double,_nullptr>(this,&val->val_);
  Fad<double>::~Fad(pFVar1);
  return;
}

Assistant:

inline void TPZLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T x = loc[0];
        phi(0,0) = (1.0-x)/2.;
        phi(1,0) = (1.0+x)/2.;
        dphi(0,0) = -0.5;
        dphi(0,1) = 0.5;
    }